

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O1

bool FIX::TimeRange::isInRange
               (DateTime *startTime,DateTime *endTime,int startDay,int endDay,DateTime *time,int day
               )

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  if (startDay == endDay) {
    if (day == startDay) {
      bVar3 = isInRange(startTime,endTime,time);
      return bVar3;
    }
    return true;
  }
  lVar2 = time->m_time;
  if (startDay < endDay) {
    if (endDay < day || day < startDay) {
      return false;
    }
  }
  else {
    if (startDay <= endDay) {
      return true;
    }
    if (day < startDay && endDay < day) {
      return false;
    }
  }
  if ((day != startDay) ||
     ((startTime->m_date < 1 && ((startTime->m_date != 0 || (startTime->m_time <= lVar2)))))) {
    if (day != endDay) {
      return true;
    }
    iVar1 = endTime->m_date;
    if (0 < iVar1) {
      return true;
    }
    if (iVar1 == 0 && lVar2 == endTime->m_time) {
      return true;
    }
    if (lVar2 < endTime->m_time && -1 < iVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool TimeRange::isInRange(
    const DateTime &startTime,
    const DateTime &endTime,
    int startDay,
    int endDay,
    const DateTime &time,
    int day) {
  UtcTimeOnly timeOnly(time);

  if (startDay == endDay) {
    if (day != startDay) {
      return true;
    }
    return isInRange(startTime, endTime, time);
  } else if (startDay < endDay) {
    if (day < startDay || day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  } else if (startDay > endDay) {
    if (day < startDay && day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  }
  return true;
}